

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_data_writer.cpp
# Opt level: O2

void __thiscall
duckdb::OptimisticDataWriter::FlushToDisk(OptimisticDataWriter *this,RowGroup *row_group)

{
  pointer pCVar1;
  CompressionType *__x;
  ColumnDefinition *column;
  pointer this_00;
  vector<duckdb::CompressionType,_true> compression_types;
  RowGroupWriteInfo info;
  _Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_> local_88;
  RowGroupWriteData local_70;
  RowGroupWriteInfo local_40;
  
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar1 = (this->table->column_definitions).
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->table->column_definitions).
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1
      ) {
    __x = ColumnDefinition::CompressionType(this_00);
    ::std::vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>::push_back
              ((vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_> *)
               &local_88,__x);
  }
  local_40.manager =
       unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>,_true>
       ::operator*(&this->partial_manager);
  local_40.checkpoint_type = FULL_CHECKPOINT;
  local_40.compression_types = (vector<duckdb::CompressionType,_true> *)&local_88;
  RowGroup::WriteToDisk(&local_70,row_group,&local_40);
  RowGroupWriteData::~RowGroupWriteData(&local_70);
  ::std::_Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>::
  ~_Vector_base(&local_88);
  return;
}

Assistant:

void OptimisticDataWriter::FlushToDisk(RowGroup &row_group) {
	//! The set of column compression types (if any)
	vector<CompressionType> compression_types;
	D_ASSERT(compression_types.empty());
	for (auto &column : table.Columns()) {
		compression_types.push_back(column.CompressionType());
	}
	RowGroupWriteInfo info(*partial_manager, compression_types);
	row_group.WriteToDisk(info);
}